

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  LLVMDataDependenceAnalysisOptions *opts;
  long lVar2;
  LLVMDataDependenceAnalysisOptions *pLVar3;
  char **in_RSI;
  uint in_EDI;
  StringRef SVar4;
  LLVMDataDependenceAnalysis DDA;
  DGLLVMPointerAnalysis PTA;
  TimeMeasure tm;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  SlicerOptions options;
  string *in_stack_fffffffffffffa48;
  SlicerOptions *in_stack_fffffffffffffa50;
  LLVMPointerAnalysis *in_stack_fffffffffffffa60;
  Module *in_stack_fffffffffffffa68;
  LLVMDataDependenceAnalysis *in_stack_fffffffffffffa70;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  LLVMDataDependenceAnalysis *in_stack_fffffffffffffa80;
  allocator local_569;
  string local_568 [72];
  LLVMPointerAnalysisOptions *in_stack_fffffffffffffae0;
  Module *in_stack_fffffffffffffae8;
  DGLLVMPointerAnalysis *in_stack_fffffffffffffaf0;
  LLVMDataDependenceAnalysis local_4a8;
  allocator local_3e1;
  string local_3e0 [312];
  size_t local_2a8;
  undefined4 local_294;
  char local_290 [8];
  SlicerOptions local_288;
  char **local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  setupStackTraceOnError(in_EDI,in_RSI);
  parseSlicerOptions((int)&local_288 + 8,(char **)(ulong)local_8,SUB81(local_10,0),false);
  llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x15db6c);
  llvm::LLVMContext::LLVMContext((LLVMContext *)&local_288);
  parseModule(local_290,(LLVMContext *)"llvm-dda-dump",&local_288);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x15dbb2);
  if (bVar1) {
    opts = (LLVMDataDependenceAnalysisOptions *)
           std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator->
                     ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x15dbde);
    llvm::StringRef::StringRef((StringRef *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    SVar4.Length = local_2a8;
    SVar4.Data = (char *)opts;
    lVar2 = llvm::Module::getFunction(SVar4);
    if (lVar2 == 0) {
      llvm::errs();
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffffa60,(char *)opts);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffffa60,(string *)opts);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffffa60,(char *)opts);
      local_4 = 1;
      local_294 = 1;
    }
    else {
      dg::debug::TimeMeasure::TimeMeasure((TimeMeasure *)in_stack_fffffffffffffa50);
      pLVar3 = (LLVMDataDependenceAnalysisOptions *)
               std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                         ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x15dc97);
      dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
                ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffffa50,
                 (LLVMPointerAnalysisOptions *)pLVar3);
      dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
                (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
      dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions
                ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffffa50);
      dg::debug::TimeMeasure::start((TimeMeasure *)in_stack_fffffffffffffa50);
      dg::DGLLVMPointerAnalysis::run((DGLLVMPointerAnalysis *)in_stack_fffffffffffffa50);
      dg::debug::TimeMeasure::stop((TimeMeasure *)in_stack_fffffffffffffa50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,"INFO: Pointer analysis took",&local_3e1);
      dg::debug::TimeMeasure::report
                ((TimeMeasure *)in_stack_fffffffffffffa80,
                 (string *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
                 (ostream *)in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      dg::debug::TimeMeasure::start((TimeMeasure *)in_stack_fffffffffffffa50);
      in_stack_fffffffffffffa50 =
           (SlicerOptions *)
           std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                     ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x15dd76);
      dg::LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions
                ((LLVMDataDependenceAnalysisOptions *)in_stack_fffffffffffffa50,pLVar3);
      dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,opts)
      ;
      dg::LLVMDataDependenceAnalysisOptions::~LLVMDataDependenceAnalysisOptions
                ((LLVMDataDependenceAnalysisOptions *)in_stack_fffffffffffffa50);
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x15ddcd);
      if (bVar1) {
        dg::dda::LLVMDataDependenceAnalysis::buildGraph
                  ((LLVMDataDependenceAnalysis *)in_stack_fffffffffffffa50);
      }
      else {
        dg::dda::LLVMDataDependenceAnalysis::run
                  ((LLVMDataDependenceAnalysis *)in_stack_fffffffffffffa50);
      }
      dg::debug::TimeMeasure::stop((TimeMeasure *)in_stack_fffffffffffffa50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_568,"INFO: Data dependence analysis took",&local_569);
      dg::debug::TimeMeasure::report
                ((TimeMeasure *)in_stack_fffffffffffffa80,
                 (string *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
                 (ostream *)in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(local_568);
      std::allocator<char>::~allocator((allocator<char> *)&local_569);
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x15de5c);
      if (bVar1) {
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                   in_stack_fffffffffffffa50);
        allocasToVars((Module *)&stack0xfffffffffffffa60);
        std::
        map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
        ::operator=((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                     *)in_stack_fffffffffffffa50,
                    (map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                     *)pLVar3);
        std::
        map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
        ::~map((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                *)0x15de97);
        bVar1 = std::
                map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                ::empty((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                         *)0x15dea3);
        if (bVar1) {
          llvm::errs();
          llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffffa60,(char *)opts);
          llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffffa60,(char *)opts);
        }
      }
      llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x15dee1);
      dumpDefs(in_stack_fffffffffffffa80,(bool)in_stack_fffffffffffffa7f);
      local_4 = 0;
      local_294 = 1;
      dg::dda::LLVMDataDependenceAnalysis::~LLVMDataDependenceAnalysis(&local_4a8);
      dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis
                ((DGLLVMPointerAnalysis *)in_stack_fffffffffffffa50);
    }
  }
  else {
    local_4 = 1;
    local_294 = 1;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
             in_stack_fffffffffffffa50);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)&local_288);
  SlicerOptions::~SlicerOptions(in_stack_fffffffffffffa50);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-dda-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    debug::TimeMeasure tm;

    DGLLVMPointerAnalysis PTA(M.get(), options.dgOptions.PTAOptions);

    tm.start();
    PTA.run();

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    tm.start();
    LLVMDataDependenceAnalysis DDA(M.get(), &PTA, options.dgOptions.DDAOptions);
    if (graph_only) {
        DDA.buildGraph();
    } else {
        DDA.run();
    }
    tm.stop();
    tm.report("INFO: Data dependence analysis took");

    if (dump_c_lines) {
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
        llvm::errs() << "WARNING: Variables names matching is not supported "
                        "for LLVM older than 3.7\n";
#else
        valuesToVars = allocasToVars(*M);
#endif // LLVM > 3.6
        if (valuesToVars.empty()) {
            llvm::errs() << "WARNING: No debugging information found, "
                         << "the C lines output will be corrupted\n";
        }
    }

    dumpDefs(&DDA, todot);

    return 0;
}